

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O0

REF_STATUS ref_face_spanning(REF_FACE ref_face,REF_INT node0,REF_INT node1,REF_INT *face)

{
  REF_INT local_3c;
  REF_INT local_38;
  int local_34;
  REF_INT local_30;
  int local_2c;
  REF_INT ref;
  REF_INT item;
  REF_INT *face_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_FACE ref_face_local;
  
  *face = -1;
  if ((node0 < 0) || (ref_face->adj->nnode <= node0)) {
    local_34 = -1;
  }
  else {
    local_34 = ref_face->adj->first[node0];
  }
  local_2c = local_34;
  if (local_34 == -1) {
    local_38 = -1;
  }
  else {
    local_38 = ref_face->adj->item[local_34].ref;
  }
  local_30 = local_38;
  while( true ) {
    if (local_2c == -1) {
      return 5;
    }
    if (((((node0 == ref_face->f2n[local_30 << 2]) || (node0 == ref_face->f2n[local_30 * 4 + 1])) ||
         (node0 == ref_face->f2n[local_30 * 4 + 2])) || (node0 == ref_face->f2n[local_30 * 4 + 3]))
       && (((node1 == ref_face->f2n[local_30 << 2] || (node1 == ref_face->f2n[local_30 * 4 + 1])) ||
           ((node1 == ref_face->f2n[local_30 * 4 + 2] || (node1 == ref_face->f2n[local_30 * 4 + 3]))
           )))) break;
    local_2c = ref_face->adj->item[local_2c].next;
    if (local_2c == -1) {
      local_3c = -1;
    }
    else {
      local_3c = ref_face->adj->item[local_2c].ref;
    }
    local_30 = local_3c;
  }
  *face = local_30;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_face_spanning(REF_FACE ref_face, REF_INT node0,
                                     REF_INT node1, REF_INT *face) {
  REF_INT item, ref;

  (*face) = REF_EMPTY;

  each_ref_adj_node_item_with_ref(ref_face_adj(ref_face), node0, item, ref) {
    if ((node0 == ref_face_f2n(ref_face, 0, ref) ||
         node0 == ref_face_f2n(ref_face, 1, ref) ||
         node0 == ref_face_f2n(ref_face, 2, ref) ||
         node0 == ref_face_f2n(ref_face, 3, ref)) &&
        (node1 == ref_face_f2n(ref_face, 0, ref) ||
         node1 == ref_face_f2n(ref_face, 1, ref) ||
         node1 == ref_face_f2n(ref_face, 2, ref) ||
         node1 == ref_face_f2n(ref_face, 3, ref))) {
      (*face) = ref;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}